

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

FIOBJ http_urlstr2fiobj(char *s,size_t len)

{
  char cVar1;
  FIOBJ o;
  fiobj_object_vtable_s *pfVar2;
  size_t size;
  uint uVar3;
  uint uVar4;
  fio_str_info_s ret;
  fio_str_info_s local_38;
  
  o = fiobj_str_buf(len);
  if (o == 0) {
LAB_0014b520:
    local_38.data = anon_var_dwarf_20f;
    local_38.len._0_4_ = 4;
    goto LAB_0014b533;
  }
  if ((o & 1) != 0) {
    fio_ltocstr(&local_38,(long)o >> 1);
    goto LAB_0014b5d0;
  }
  uVar3 = (uint)o & 6;
  cVar1 = '(';
  switch(uVar3) {
  case 0:
switchD_0014b4ee_caseD_0:
    cVar1 = *(char *)(o & 0xfffffffffffffff8);
    break;
  case 4:
switchD_0014b4ee_caseD_4:
    cVar1 = '*';
    break;
  case 6:
    if ((char)o == '&') {
      local_38.data = anon_var_dwarf_21a;
      local_38.len._0_4_ = 5;
    }
    else {
      uVar4 = (uint)o & 0xff;
      if (uVar4 != 0x16) {
        if (uVar4 == 6) goto LAB_0014b520;
        switch(uVar3) {
        case 0:
          goto switchD_0014b4ee_caseD_0;
        case 4:
          goto switchD_0014b4ee_caseD_4;
        case 6:
          cVar1 = (char)o;
        }
        break;
      }
      local_38.data = anon_var_dwarf_225;
      local_38.len._0_4_ = 4;
    }
LAB_0014b533:
    local_38.capa._0_4_ = 0;
    local_38.capa._4_4_ = 0;
    local_38.len._4_4_ = 0;
    goto LAB_0014b5d0;
  }
  switch(cVar1) {
  case '\'':
    pfVar2 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case '(':
    pfVar2 = &FIOBJECT_VTABLE_STRING;
    break;
  case ')':
    pfVar2 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case '*':
    pfVar2 = &FIOBJECT_VTABLE_HASH;
    break;
  case '+':
    pfVar2 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    pfVar2 = &FIOBJECT_VTABLE_NUMBER;
  }
  (*pfVar2->to_str)(&local_38,o);
LAB_0014b5d0:
  size = http_decode_url(local_38.data,s,len);
  if ((long)size < 0) {
    fiobj_free(o);
    o = fiobj_str_new((char *)0x0,0);
  }
  else {
    fiobj_str_resize(o,size);
  }
  return o;
}

Assistant:

static inline FIOBJ http_urlstr2fiobj(char *s, size_t len) {
  FIOBJ o = fiobj_str_buf(len);
  ssize_t l = http_decode_url(fiobj_obj2cstr(o).data, s, len);
  if (l < 0) {
    fiobj_free(o);
    return fiobj_str_new(NULL, 0); /* empty string */
  }
  fiobj_str_resize(o, (size_t)l);
  return o;
}